

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_b963::read_modern_inc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  file file;
  char *file_name_local;
  path local_38;
  
  file_name_local = file_name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&file_name_local,auto_format);
  io::open_file((io *)&file,&local_38,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_38);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_pathname._M_string_length = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_pathname.field_2._M_allocated_capacity = 0x7fffffffffffffff;
  local_38._M_pathname._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  io::
  read_all<io::posix::file,io::net::dynamic_vector_buffer<unsigned_char,std::allocator<unsigned_char>>,void>
            (&file,(dynamic_vector_buffer<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38
            );
  io::posix::file_descriptor_handle::~file_descriptor_handle(&file.fd_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_modern_inc(const char* file_name)
{
    auto file = io::open_file(file_name, io::open_mode::read_only);
    std::vector<uint8_t> output;
    io::read_all(file, io::dynamic_buffer(output));
    return output;
}